

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzePreModify(ExpressionContext *ctx,SynPreModify *syntax)

{
  uint uVar1;
  VariableData *pVVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  ExprGetAddress *pEVar6;
  undefined4 extraout_var;
  TypeRef *type;
  VariableHandle *variable;
  ExprBase *pEVar7;
  TypeBase *pTVar8;
  undefined4 extraout_var_02;
  TypeBase *pTVar9;
  ExprError *pEVar10;
  undefined1 uVar11;
  char *pcVar12;
  ExprDereference *node;
  ExprGetAddress *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pEVar6 = (ExprGetAddress *)AnalyzeExpression(ctx,syntax->value);
  pTVar9 = (pEVar6->super_ExprBase).type;
  if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0)) {
    uVar1 = (pEVar6->super_ExprBase).typeID;
    if (uVar1 == 0x16) {
      this = (ExprGetAddress *)pEVar6->variable;
    }
    else {
      this = pEVar6;
      if (uVar1 == 0x22) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        this = (ExprGetAddress *)CONCAT44(extraout_var,iVar5);
        type = ExpressionContext::GetReferenceType(ctx,(pEVar6->super_ExprBase).type);
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar5);
        pVVar2 = (VariableData *)pEVar6->variable;
        variable->source = (pEVar6->super_ExprBase).source;
        variable->variable = pVVar2;
        variable->next = (VariableHandle *)0x0;
        variable->listed = false;
        ExprGetAddress::ExprGetAddress(this,&syntax->super_SynBase,&type->super_TypeBase,variable);
      }
    }
    pTVar9 = (this->super_ExprBase).type;
    if ((pTVar9 == (TypeBase *)0x0) || (pTVar9->typeID != 0x12)) {
      pTVar8 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pTVar9 = (pEVar6->super_ExprBase).type;
      pEVar10 = anon_unknown.dwarf_b837c::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar8,
                           "ERROR: cannot change immutable value of type %.*s",
                           (ulong)(uint)(*(int *)&(pTVar9->name).end - (int)(pTVar9->name).begin));
      return &pEVar10->super_ExprBase;
    }
    bVar4 = ExpressionContext::IsNumericType(ctx,(pEVar6->super_ExprBase).type);
    if (!bVar4) {
      pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pcVar12 = "decrement";
      if (syntax->isIncrement != false) {
        pcVar12 = "increment";
      }
      pTVar8 = (pEVar6->super_ExprBase).type;
      pcVar3 = (pTVar8->name).begin;
      pEVar10 = anon_unknown.dwarf_b837c::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar9,
                           "ERROR: %s is not supported on \'%.*s\'",pcVar12,
                           (ulong)(uint)(*(int *)&(pTVar8->name).end - (int)pcVar3),pcVar3);
      return &pEVar10->super_ExprBase;
    }
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar5);
    pTVar9 = (pEVar6->super_ExprBase).type;
    uVar11 = syntax->isIncrement;
    pEVar7->typeID = 0x10;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar9;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240cb0;
    pEVar7[1]._vptr_ExprBase = (_func_int **)this;
  }
  else {
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar5);
    pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    uVar11 = syntax->isIncrement;
    pEVar7->typeID = 0x10;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar9;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240cb0;
    pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar6;
  }
  *(undefined1 *)&pEVar7[1].typeID = uVar11;
  return pEVar7;
}

Assistant:

ExprBase* AnalyzePreModify(ExpressionContext &ctx, SynPreModify *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, ctx.GetErrorType(), value, syntax->isIncrement);

	ExprBase* wrapped = value;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(syntax, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	else if(ExprDereference *node = getType<ExprDereference>(value))
		wrapped = node->value;

	if(!isType<TypeRef>(wrapped->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(value->type->name));

	if(!ctx.IsNumericType(value->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: %s is not supported on '%.*s'", (syntax->isIncrement ? "increment" : "decrement"), FMT_ISTR(value->type->name));

	return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, value->type, wrapped, syntax->isIncrement);
}